

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O2

void * gdDPExtractData(gdIOCtx *ctx,int *size)

{
  dynamicPtr *dp;
  void *pvVar1;
  
  dp = (dynamicPtr *)ctx[1].getC;
  if (dp->dataGood == 0) {
    *size = 0;
    if ((dp->data != (void *)0x0) && (dp->freeOK != 0)) {
      gdFree(dp->data);
    }
    pvVar1 = (void *)0x0;
  }
  else {
    if (dp->freeOK != 0) {
      gdReallocDynamic(dp,dp->logicalSize);
    }
    *size = dp->logicalSize;
    pvVar1 = dp->data;
  }
  dp->data = (void *)0x0;
  dp->logicalSize = 0;
  dp->realSize = 0;
  return pvVar1;
}

Assistant:

BGD_DECLARE(void *) gdDPExtractData (struct gdIOCtx *ctx, int *size)
{
	dynamicPtr *dp;
	dpIOCtx *dctx;
	void *data;

	dctx = (dpIOCtx *)ctx;
	dp = dctx->dp;

	/* clean up the data block and return it */
	if(dp->dataGood) {
		trimDynamic(dp);
		*size = dp->logicalSize;
		data = dp->data;
	} else {
		*size = 0;
		data = NULL;
		/* 2.0.21: never free memory we don't own */
		if((dp->data != NULL) && (dp->freeOK)) {
			gdFree(dp->data);
		}
	}

	dp->data = NULL;
	dp->realSize = 0;
	dp->logicalSize = 0;

	return data;
}